

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O3

int xmlwrite_sum(archive_write *a,xml_writer *writer,char *key,chksumval_conflict *sum)

{
  byte bVar1;
  sumalg sVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *attrvalue;
  long lVar7;
  char buff [41];
  char local_48 [48];
  
  if (sum->len != 0) {
    sVar2 = sum->alg;
    pcVar6 = "sha1";
    if (sVar2 != CKSUM_SHA1) {
      pcVar6 = (char *)0x0;
    }
    iVar4 = 0x14;
    if (sVar2 != CKSUM_SHA1) {
      iVar4 = 0;
    }
    attrvalue = "md5";
    if (sVar2 != CKSUM_MD5) {
      attrvalue = pcVar6;
    }
    iVar3 = 0x10;
    if (sVar2 != CKSUM_MD5) {
      iVar3 = iVar4;
    }
    if (attrvalue != (char *)0x0) {
      pcVar5 = local_48;
      pcVar6 = local_48;
      if (iVar3 != 0) {
        lVar7 = 0;
        do {
          bVar1 = sum->val[lVar7];
          *pcVar5 = "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef"
                    [(ulong)(bVar1 >> 4) + 0x70];
          pcVar5[1] = "0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef0123456789abcdef"
                      [(ulong)(bVar1 & 0xf) + 0x70];
          pcVar5 = pcVar5 + 2;
          lVar7 = lVar7 + 1;
          pcVar6 = pcVar5;
        } while (iVar3 != (int)lVar7);
      }
      *pcVar6 = '\0';
      iVar4 = xmlwrite_string_attr(a,writer,key,local_48,"style",attrvalue);
      if (iVar4 < 0) {
        return -0x1e;
      }
    }
  }
  return 0;
}

Assistant:

static int
xmlwrite_sum(struct archive_write *a, struct xml_writer *writer,
	const char *key, struct chksumval *sum)
{
	const char *algname;
	int algsize;
	char buff[MAX_SUM_SIZE*2 + 1];
	char *p;
	unsigned char *s;
	int i, r;

	if (sum->len > 0) {
		algname = getalgname(sum->alg);
		algsize = getalgsize(sum->alg);
		if (algname != NULL) {
			const char *hex = "0123456789abcdef";
			p = buff;
			s = sum->val;
			for (i = 0; i < algsize; i++) {
				*p++ = hex[(*s >> 4)];
				*p++ = hex[(*s & 0x0f)];
				s++;
			}
			*p = '\0';
			r = xmlwrite_string_attr(a, writer,
			    key, buff,
			    "style", algname);
			if (r < 0)
				return (ARCHIVE_FATAL);
		}
	}
	return (ARCHIVE_OK);
}